

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O3

void Dar_BalanceUniqify(Aig_Obj_t *pObj,Vec_Ptr_t *vNodes,int fExor)

{
  void **ppvVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = vNodes->nSize;
  if (1 < (long)(int)uVar6) {
    qsort(vNodes->pArray,(long)(int)uVar6,8,Dar_ObjCompareLits);
    uVar6 = vNodes->nSize;
  }
  if ((int)uVar6 < 1) {
    if ((int)uVar6 < 0) goto LAB_0048d524;
LAB_0048d471:
    vNodes->nSize = 0;
  }
  else {
    uVar3 = 0;
    uVar7 = 0;
    do {
      ppvVar1 = vNodes->pArray;
      pvVar5 = ppvVar1[uVar7];
      uVar4 = (uint)uVar7 + 1;
      if (uVar4 == uVar6) {
        if (((int)uVar3 < 0) || (uVar6 <= uVar3)) {
LAB_0048d505:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        uVar7 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
        ppvVar1[uVar7] = pvVar5;
        break;
      }
      if ((int)uVar6 <= (int)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((fExor == 0) && (pvVar5 == (void *)((ulong)ppvVar1[uVar4] ^ 1))) goto LAB_0048d471;
      if (pvVar5 == ppvVar1[uVar4]) {
        if (fExor == 0) {
          uVar4 = (uint)uVar7;
        }
        uVar4 = uVar4 + 1;
      }
      else {
        if (((int)uVar3 < 0) || (uVar6 <= uVar3)) goto LAB_0048d505;
        uVar7 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
        ppvVar1[uVar7] = pvVar5;
      }
      uVar7 = (ulong)uVar4;
    } while ((int)uVar4 < (int)uVar6);
    if ((int)uVar6 < (int)uVar3) {
LAB_0048d524:
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    vNodes->nSize = uVar3;
    if (1 < (int)uVar3) {
      uVar7 = 1;
      pvVar5 = *vNodes->pArray;
      do {
        pvVar2 = vNodes->pArray[uVar7];
        if (pvVar5 == pvVar2) {
          __assert_fail("pTemp != pTempNext",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                        ,0x5a,"void Dar_BalanceUniqify(Aig_Obj_t *, Vec_Ptr_t *, int)");
        }
        uVar7 = uVar7 + 1;
        pvVar5 = pvVar2;
      } while (uVar3 != uVar7);
    }
  }
  return;
}

Assistant:

void Dar_BalanceUniqify( Aig_Obj_t * pObj, Vec_Ptr_t * vNodes, int fExor )
{
    Aig_Obj_t * pTemp, * pTempNext;
    int i, k;
    // sort the nodes by their literal
    Vec_PtrSort( vNodes, (int (*)())Dar_ObjCompareLits );
    // remove duplicates
    k = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pTemp, i )
    {
        if ( i + 1 == Vec_PtrSize(vNodes) )
        {
            Vec_PtrWriteEntry( vNodes, k++, pTemp );
            break;
        }
        pTempNext = (Aig_Obj_t *)Vec_PtrEntry( vNodes, i+1 );
        if ( !fExor && pTemp == Aig_Not(pTempNext) ) // pos_lit & neg_lit = 0
        {
            Vec_PtrClear( vNodes );
            return;
        }
        if ( pTemp != pTempNext )  // save if different
            Vec_PtrWriteEntry( vNodes, k++, pTemp );
        else if ( fExor ) // in case of XOR, remove identical
            i++;
    }
    Vec_PtrShrink( vNodes, k );
    if ( Vec_PtrSize(vNodes) < 2 )
        return;
    // check that there is no duplicates
    pTemp = (Aig_Obj_t *)Vec_PtrEntry( vNodes, 0 );
    Vec_PtrForEachEntryStart( Aig_Obj_t *, vNodes, pTempNext, i, 1 )
    {
        assert( pTemp != pTempNext );
        pTemp = pTempNext;
    }
}